

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builderutil_find_polygon_degeneracies.cc
# Opt level: O2

vector<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_> *
s2builderutil::FindPolygonDegeneracies
          (vector<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
           *__return_storage_ptr__,Graph *g,S2Error *error)

{
  pointer ppVar1;
  int iVar2;
  PolygonDegeneracy PVar3;
  uint uVar4;
  pointer ppVar5;
  pointer pVVar6;
  pointer pPVar7;
  pointer __first;
  pointer pSVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  const_reference cVar12;
  int iVar13;
  int iVar14;
  pointer pCVar15;
  pointer pCVar16;
  ulong uVar17;
  _Tp_alloc_type *__alloc;
  Component *__args;
  Component *extraout_RDX;
  Component *__args_00;
  pointer pSVar18;
  ulong uVar19;
  long lVar20;
  iterator __begin2;
  ulong uVar21;
  ulong uVar22;
  size_type sVar23;
  EdgeId e;
  int iVar24;
  pointer pPVar25;
  iterator __begin2_1;
  size_type sVar26;
  reference rVar27;
  iterator __end2;
  ulong local_2a0;
  pointer local_298;
  __uniq_ptr_impl<S2Shape,_std::default_delete<S2Shape>_> local_270;
  pointer local_268;
  int local_25c;
  vector<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
  components;
  vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_> crossing_edges;
  undefined1 local_218 [12];
  undefined4 uStack_20c;
  undefined4 uStack_208;
  undefined4 uStack_204;
  pointer pPStack_200;
  VType local_1f8;
  VType local_1e8;
  VType VStack_1e0;
  VType local_1d8;
  VType VStack_1d0;
  VType local_1c8;
  VType VStack_1c0;
  DegeneracyFinder local_1a8;
  S2CrossingEdgeQuery query;
  vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> frontier;
  
  anon_unknown_0::CheckGraphOptions(g);
  if ((g->options_).sibling_pairs_ == DISCARD && (g->options_).degenerate_edges_ == DISCARD) {
    (__return_storage_ptr__->
    super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    local_1a8.g_ = g;
    S2Builder::Graph::VertexInMap::VertexInMap(&local_1a8.in_,g);
    S2Builder::Graph::VertexOutMap::VertexOutMap(&local_1a8.out_,local_1a8.g_);
    local_1a8.is_vertex_used_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_1a8.is_vertex_used_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
    local_1a8.is_vertex_used_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_1a8.is_vertex_used_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    local_1a8.is_edge_degeneracy_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_1a8.is_edge_degeneracy_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    local_1a8.is_vertex_unbalanced_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_1a8.is_vertex_unbalanced_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    local_1a8.is_vertex_unbalanced_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
    local_1a8.is_edge_degeneracy_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
    local_1a8.is_vertex_used_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
    local_1a8.is_edge_degeneracy_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_1a8.is_vertex_unbalanced_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
    local_1a8.is_edge_degeneracy_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
    local_1a8.is_vertex_unbalanced_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    std::vector<bool,_std::allocator<bool>_>::resize
              (&local_1a8.is_edge_degeneracy_,
               (long)(int)((ulong)((long)((local_1a8.g_)->edges_->
                                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                         )._M_impl.super__Vector_impl_data._M_finish -
                                  (long)((local_1a8.g_)->edges_->
                                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start) >> 3),false);
    iVar24 = 0;
    std::vector<bool,_std::allocator<bool>_>::resize
              (&local_1a8.is_vertex_unbalanced_,(long)(local_1a8.g_)->num_vertices_,false);
    uVar17 = (ulong)((long)((local_1a8.g_)->edges_->
                           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                    (long)((local_1a8.g_)->edges_->
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          )._M_impl.super__Vector_impl_data._M_start) >> 3;
    iVar14 = (int)uVar17;
    uVar21 = (ulong)iVar14;
    uVar22 = 0;
    if (0 < iVar14) {
      uVar22 = uVar17 & 0xffffffff;
    }
    uVar17 = 0;
    for (sVar26 = 0; sVar26 != uVar22; sVar26 = sVar26 + 1) {
      ppVar5 = ((local_1a8.g_)->edges_->
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      iVar14 = ppVar5[sVar26].first;
      iVar13 = ppVar5[sVar26].second;
      if (iVar14 == iVar13) {
        rVar27 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (&local_1a8.is_edge_degeneracy_,sVar26);
LAB_00210284:
        *rVar27._M_p = *rVar27._M_p | rVar27._M_mask;
        iVar24 = iVar24 + 1;
      }
      else {
        uVar17 = (ulong)(int)uVar17;
        uVar19 = uVar17;
        if ((long)uVar17 < (long)uVar21) {
          uVar19 = uVar21;
        }
        lVar20 = uVar17 << 0x20;
        for (; (long)uVar17 < (long)uVar21; uVar17 = uVar17 + 1) {
          if ((iVar14 <= ppVar5[local_1a8.in_.in_edge_ids_.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[uVar17]].second) &&
             ((iVar14 < ppVar5[local_1a8.in_.in_edge_ids_.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[uVar17]].second ||
              (iVar13 <= ppVar5[local_1a8.in_.in_edge_ids_.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[uVar17]].first)))) {
            iVar2 = *(int *)((long)local_1a8.in_.in_edge_ids_.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start + (lVar20 >> 0x1e));
            if ((ppVar5[iVar2].second != iVar14) || (ppVar5[iVar2].first != iVar13))
            goto LAB_002102d4;
            rVar27 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               (&local_1a8.is_edge_degeneracy_,sVar26);
            goto LAB_00210284;
          }
          lVar20 = lVar20 + 0x100000000;
        }
        uVar17 = uVar19 & 0xffffffff;
LAB_002102d4:
        rVar27 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (&local_1a8.is_vertex_unbalanced_,(long)iVar14);
        *rVar27._M_p = *rVar27._M_p | rVar27._M_mask;
      }
    }
    if (iVar24 == 0) {
      (__return_storage_ptr__->
      super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    else if (iVar24 == (int)((ulong)((long)((local_1a8.g_)->edges_->
                                           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)((local_1a8.g_)->edges_->
                                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start) >> 3)) {
      bVar9 = S2Builder::Graph::IsFullPolygon(local_1a8.g_,error);
      std::
      vector<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>::
      vector(__return_storage_ptr__,
             (long)(int)((ulong)((long)((local_1a8.g_)->edges_->
                                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish -
                                (long)((local_1a8.g_)->edges_->
                                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start) >> 3),
             (allocator_type *)local_218);
      for (lVar20 = 0;
          lVar20 < (int)((ulong)((long)((local_1a8.g_)->edges_->
                                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish -
                                (long)((local_1a8.g_)->edges_->
                                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start) >> 3);
          lVar20 = lVar20 + 1) {
        (__return_storage_ptr__->
        super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
        )._M_impl.super__Vector_impl_data._M_start[lVar20] =
             (PolygonDegeneracy)((uint)bVar9 * -0x80000000 + (int)lVar20);
      }
    }
    else {
      components.
      super__Vector_base<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      components.
      super__Vector_base<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      components.
      super__Vector_base<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      iVar14 = 0;
      std::vector<bool,_std::allocator<bool>_>::resize
                (&local_1a8.is_vertex_used_,(long)(local_1a8.g_)->num_vertices_,false);
      local_2a0 = 0xffffffffffffffff;
      pCVar15 = (pointer)0x0;
      __end2._M_current = (Component *)0x0;
      local_298 = (pointer)0x0;
      iVar24 = 0;
      for (sVar26 = 0;
          (long)sVar26 <
          (long)(int)((ulong)((long)((local_1a8.g_)->edges_->
                                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                             (long)((local_1a8.g_)->edges_->
                                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start) >> 3);
          sVar26 = sVar26 + 1) {
        rVar27 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (&local_1a8.is_edge_degeneracy_,sVar26);
        if ((*rVar27._M_p & rVar27._M_mask) != 0) {
          PVar3 = (PolygonDegeneracy)
                  ((local_1a8.g_)->edges_->
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                  _M_impl.super__Vector_impl_data._M_start[sVar26].first;
          local_268 = pCVar15;
          rVar27 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             (&local_1a8.is_vertex_used_,(long)(int)PVar3);
          pCVar15 = local_268;
          if ((*rVar27._M_p & rVar27._M_mask) == 0) {
            uStack_204 = 0;
            pPStack_200 = (pointer)0x0;
            local_218._4_4_ = 0;
            local_218._8_4_ = 0;
            uStack_20c = 0;
            uStack_208 = 0;
            frontier.
            super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            frontier.
            super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>._M_impl
            .super__Vector_impl_data._M_start = (pointer)0x0;
            frontier.
            super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>._M_impl
            .super__Vector_impl_data._M_finish = (pointer)0x0;
            query.index_ = (S2ShapeIndex *)CONCAT35(query.index_._5_3_,0x100000000);
            query.index_ = (S2ShapeIndex *)CONCAT44(query.index_._4_4_,PVar3);
            local_218._0_4_ = PVar3;
            std::vector<std::pair<int,bool>,std::allocator<std::pair<int,bool>>>::
            emplace_back<std::pair<int,bool>>
                      ((vector<std::pair<int,bool>,std::allocator<std::pair<int,bool>>> *)&frontier,
                       (pair<int,_bool> *)&query);
            local_25c = iVar24;
            rVar27 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               (&local_1a8.is_vertex_used_,(long)(int)PVar3);
            *rVar27._M_p = *rVar27._M_p | rVar27._M_mask;
            while (frontier.
                   super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>.
                   _M_impl.super__Vector_impl_data._M_start !=
                   frontier.
                   super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish) {
              ppVar1 = frontier.
                       super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish + -1;
              iVar24 = frontier.
                       super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1].first;
              sVar23 = (size_type)iVar24;
              bVar9 = frontier.
                      super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish[-1].second;
              frontier.
              super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = ppVar1;
              if ((local_218._4_4_ == 0) &&
                 (rVar27 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                     (&local_1a8.is_vertex_unbalanced_,sVar23),
                 (*rVar27._M_p & rVar27._M_mask) != 0)) {
                iVar13 = anon_unknown_0::DegeneracyFinder::ContainsVertexSign(&local_1a8,iVar24);
                if (iVar13 == 0) {
                  S2LogMessage::S2LogMessage
                            ((S2LogMessage *)&query,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builderutil_find_polygon_degeneracies.cc"
                             ,0xe2,kFatal,(ostream *)&std::cerr);
                  std::operator<<((ostream *)query.a0_.c_[0],"Check failed: (v0_sign) != (0) ");
                  goto LAB_00210ce2;
                }
                local_218._4_4_ = -iVar13;
                if (bVar9 != false) {
                  local_218._4_4_ = iVar13;
                }
              }
              iVar13 = local_1a8.out_.edge_begins_.super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_start[sVar23 + 1];
              for (sVar23 = (size_type)
                            local_1a8.out_.edge_begins_.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[sVar23]; (long)iVar13 != sVar23;
                  sVar23 = sVar23 + 1) {
                iVar2 = ((local_1a8.g_)->edges_->
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        )._M_impl.super__Vector_impl_data._M_start[sVar23].second;
                bVar10 = anon_unknown_0::DegeneracyFinder::CrossingParity
                                   (&local_1a8,iVar24,iVar2,false);
                rVar27 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                   (&local_1a8.is_edge_degeneracy_,sVar23);
                if ((*rVar27._M_p & rVar27._M_mask) != 0) {
                  query.index_ = (S2ShapeIndex *)
                                 CONCAT44(query.index_._4_4_,
                                          (uint)(bVar9 != bVar10) << 0x1f |
                                          (uint)sVar23 & 0x7fffffff);
                  std::
                  vector<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                  ::emplace_back<s2builderutil::PolygonDegeneracy>
                            ((vector<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                              *)(local_218 + 8),(PolygonDegeneracy *)&query);
                }
                rVar27 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                   (&local_1a8.is_vertex_used_,(long)iVar2);
                if ((*rVar27._M_p & rVar27._M_mask) == 0) {
                  bVar11 = anon_unknown_0::DegeneracyFinder::CrossingParity
                                     (&local_1a8,iVar2,iVar24,true);
                  query.index_ = (S2ShapeIndex *)
                                 CONCAT44(CONCAT31(query.index_._5_3_,(bVar9 != bVar10) != bVar11),
                                          iVar2);
                  std::vector<std::pair<int,bool>,std::allocator<std::pair<int,bool>>>::
                  emplace_back<std::pair<int,bool>>
                            ((vector<std::pair<int,bool>,std::allocator<std::pair<int,bool>>> *)
                             &frontier,(pair<int,_bool> *)&query);
                  rVar27 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                     (&local_1a8.is_vertex_used_,(long)iVar2);
                  *rVar27._M_p = *rVar27._M_p | rVar27._M_mask;
                }
              }
            }
            std::_Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>::
            ~_Vector_base(&frontier.
                           super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>
                         );
            __first = components.
                      super__Vector_base<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            bVar9 = local_218._4_4_ == 0;
            uVar17 = (ulong)(uint)PVar3;
            if (bVar9) {
              uVar17 = local_2a0;
            }
            local_2a0 = uVar17 & 0xffffffff;
            if (!bVar9) {
              iVar14 = local_218._4_4_;
            }
            if (__end2._M_current == local_268) {
              if ((long)local_268 -
                  (long)components.
                        super__Vector_base<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
                        ._M_impl.super__Vector_impl_data._M_start == 0x7fffffffffffffe0) {
                std::__throw_length_error("vector::_M_realloc_insert");
              }
              uVar21 = (long)local_268 -
                       (long)components.
                             super__Vector_base<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5;
              uVar17 = uVar21;
              if (local_268 ==
                  components.
                  super__Vector_base<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
                uVar17 = 1;
              }
              uVar22 = uVar17 + uVar21;
              __alloc = (_Tp_alloc_type *)0x3ffffffffffffff;
              if (0x3fffffffffffffe < uVar22) {
                uVar22 = 0x3ffffffffffffff;
              }
              if (CARRY8(uVar17,uVar21)) {
                uVar22 = 0x3ffffffffffffff;
              }
              if (uVar22 == 0) {
                local_298 = (pointer)0x0;
                __args_00 = __args;
              }
              else {
                local_298 = (pointer)operator_new(uVar22 << 5);
                __args_00 = extraout_RDX;
              }
              std::allocator_traits<std::allocator<s2builderutil::(anonymous_namespace)::Component>>
              ::
              construct<s2builderutil::(anonymous_namespace)::Component,s2builderutil::(anonymous_namespace)::Component_const&>
                        ((allocator_type *)(local_298 + uVar21),(Component *)local_218,__args_00);
              pCVar15 = std::
                        vector<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
                        ::_S_relocate(__first,__end2._M_current,local_298,__alloc);
              pCVar16 = std::
                        vector<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
                        ::_S_relocate(__end2._M_current,__end2._M_current,pCVar15 + 1,__alloc);
              if (__first != (pointer)0x0) {
                operator_delete(__first);
              }
              pCVar15 = local_298 + uVar22;
              components.
              super__Vector_base<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
              ._M_impl.super__Vector_impl_data._M_start = local_298;
              components.
              super__Vector_base<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
              ._M_impl.super__Vector_impl_data._M_finish = pCVar16;
              components.
              super__Vector_base<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = pCVar15;
            }
            else {
              std::allocator_traits<std::allocator<s2builderutil::(anonymous_namespace)::Component>>
              ::
              construct<s2builderutil::(anonymous_namespace)::Component,s2builderutil::(anonymous_namespace)::Component_const&>
                        ((allocator_type *)__end2._M_current,(Component *)local_218,__args);
              pCVar15 = local_268;
              components.
              super__Vector_base<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
              ._M_impl.super__Vector_impl_data._M_finish = __end2._M_current + 1;
            }
            __end2._M_current =
                 components.
                 super__Vector_base<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            iVar24 = local_25c + (uint)bVar9;
            std::
            _Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
            ::~_Vector_base((_Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                             *)(local_218 + 8));
          }
        }
      }
      if (0 < iVar24) {
        if (iVar14 == 0) {
          for (local_2a0 = 0; (long)local_2a0 < (long)(local_1a8.g_)->num_vertices_;
              local_2a0 = local_2a0 + 1) {
            cVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               (&local_1a8.is_vertex_unbalanced_,local_2a0);
            if (cVar12) {
              iVar14 = anon_unknown_0::DegeneracyFinder::ContainsVertexSign
                                 (&local_1a8,(VertexId)local_2a0);
              goto LAB_002108a4;
            }
          }
          S2LogMessage::S2LogMessage
                    ((S2LogMessage *)local_218,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builderutil_find_polygon_degeneracies.cc"
                     ,0x118,kFatal,(ostream *)&std::cerr);
          std::operator<<((ostream *)CONCAT44(uStack_20c,local_218._8_4_),
                          "Could not find previously marked unbalanced vertex");
LAB_00210ce2:
          abort();
        }
LAB_002108a4:
        lVar20 = (long)(int)local_2a0;
        if (iVar24 < 0x15) {
          local_1f8 = 0.0;
          uStack_208 = 0;
          uStack_204 = 0;
          pPStack_200 = (pointer)0x0;
          local_1e8 = 0.0;
          VStack_1e0 = 0.0;
          local_1d8 = 0.0;
          VStack_1d0 = 0.0;
          local_1c8 = 0.0;
          VStack_1c0 = 0.0;
          for (pCVar15 = local_298; pCVar15 != __end2._M_current; pCVar15 = pCVar15 + 1) {
            if (pCVar15->root_sign == 0) {
              pVVar6 = ((local_1a8.g_)->vertices_->
                       super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              S2EdgeCrosser::Init((S2EdgeCrosser *)local_218,pVVar6 + lVar20,pVVar6 + pCVar15->root)
              ;
              bVar9 = 0 < iVar14;
              for (sVar26 = 0;
                  (long)sVar26 <
                  (long)(int)((ulong)((long)((local_1a8.g_)->edges_->
                                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                            )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)((local_1a8.g_)->edges_->
                                           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start) >> 3);
                  sVar26 = sVar26 + 1) {
                cVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                   (&local_1a8.is_edge_degeneracy_,sVar26);
                if (!cVar12) {
                  ppVar5 = ((local_1a8.g_)->edges_->
                           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                  pVVar6 = ((local_1a8.g_)->vertices_->
                           super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                  bVar10 = S2EdgeCrosser::EdgeOrVertexCrossing
                                     ((S2EdgeCrosser *)local_218,pVVar6 + ppVar5[sVar26].first,
                                      pVVar6 + ppVar5[sVar26].second);
                  bVar9 = (bool)(bVar10 ^ bVar9);
                }
              }
              pCVar15->root_sign = bVar9 - 1 | 1;
            }
          }
        }
        else {
          MutableS2ShapeIndex::MutableS2ShapeIndex((MutableS2ShapeIndex *)&frontier);
          query.index_ = (S2ShapeIndex *)local_1a8.g_;
          absl::make_unique<s2builderutil::GraphShape,S2Builder::Graph_const*>
                    ((absl *)local_218,(Graph **)&query);
          local_270._M_t.super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>.
          super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl._4_4_ = local_218._4_4_;
          local_270._M_t.super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>.
          super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl._0_4_ = local_218._0_4_;
          local_218._0_4_ = (PolygonDegeneracy)0x0;
          local_218._4_4_ = 0;
          MutableS2ShapeIndex::Add
                    ((MutableS2ShapeIndex *)&frontier,
                     (unique_ptr<S2Shape,_std::default_delete<S2Shape>_> *)&local_270);
          if ((_Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>)
              local_270._M_t.super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>.
              super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl != (S2Shape *)0x0) {
            (**(code **)(*(long *)local_270._M_t.
                                  super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>.
                                  super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl + 8))();
          }
          local_270._M_t.super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>.
          super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl =
               (tuple<S2Shape_*,_std::default_delete<S2Shape>_>)
               (_Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>)0x0;
          std::
          unique_ptr<s2builderutil::GraphShape,_std::default_delete<s2builderutil::GraphShape>_>::
          ~unique_ptr((unique_ptr<s2builderutil::GraphShape,_std::default_delete<s2builderutil::GraphShape>_>
                       *)local_218);
          S2CrossingEdgeQuery::S2CrossingEdgeQuery(&query,(S2ShapeIndex *)&frontier);
          crossing_edges.
          super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          crossing_edges.
          super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          crossing_edges.
          super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          uStack_208 = 0;
          uStack_204 = 0;
          pPStack_200 = (pointer)0x0;
          local_1f8 = 0.0;
          local_1e8 = 0.0;
          VStack_1e0 = 0.0;
          local_1d8 = 0.0;
          VStack_1d0 = 0.0;
          local_1c8 = 0.0;
          VStack_1c0 = 0.0;
          for (pCVar15 = local_298; pCVar15 != __end2._M_current; pCVar15 = pCVar15 + 1) {
            if (pCVar15->root_sign == 0) {
              pVVar6 = ((local_1a8.g_)->vertices_->
                       super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              S2EdgeCrosser::Init((S2EdgeCrosser *)local_218,pVVar6 + lVar20,pVVar6 + pCVar15->root)
              ;
              pVVar6 = ((local_1a8.g_)->vertices_->
                       super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              S2CrossingEdgeQuery::GetCandidates
                        (&query,pVVar6 + lVar20,pVVar6 + pCVar15->root,
                         (S2Shape *)
                         *frontier.
                          super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,&crossing_edges);
              pSVar8 = crossing_edges.
                       super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              bVar9 = 0 < iVar14;
              for (pSVar18 = crossing_edges.
                             super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>
                             ._M_impl.super__Vector_impl_data._M_start; pSVar18 != pSVar8;
                  pSVar18 = pSVar18 + 1) {
                sVar26 = (size_type)pSVar18->edge_id;
                cVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                   (&local_1a8.is_edge_degeneracy_,sVar26);
                if (!cVar12) {
                  ppVar5 = ((local_1a8.g_)->edges_->
                           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                  pVVar6 = ((local_1a8.g_)->vertices_->
                           super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                  bVar10 = S2EdgeCrosser::EdgeOrVertexCrossing
                                     ((S2EdgeCrosser *)local_218,pVVar6 + ppVar5[sVar26].first,
                                      pVVar6 + ppVar5[sVar26].second);
                  bVar9 = (bool)(bVar10 ^ bVar9);
                }
              }
              pCVar15->root_sign = bVar9 - 1 | 1;
            }
          }
          std::_Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>::
          ~_Vector_base(&crossing_edges.
                         super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>
                       );
          S2CrossingEdgeQuery::~S2CrossingEdgeQuery(&query);
          MutableS2ShapeIndex::~MutableS2ShapeIndex((MutableS2ShapeIndex *)&frontier);
        }
      }
      (__return_storage_ptr__->
      super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      for (; local_298 != __end2._M_current; local_298 = local_298 + 1) {
        uVar4 = local_298->root_sign;
        if (uVar4 == 0) {
          S2LogMessage::S2LogMessage
                    ((S2LogMessage *)local_218,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builderutil_find_polygon_degeneracies.cc"
                     ,0x15d,kFatal,(ostream *)&std::cerr);
          std::operator<<((ostream *)CONCAT44(uStack_20c,local_218._8_4_),
                          "Check failed: (component.root_sign) != (0) ");
          goto LAB_00210ce2;
        }
        pPVar7 = (local_298->degeneracies).
                 super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pPVar25 = (local_298->degeneracies).
                       super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                       ._M_impl.super__Vector_impl_data._M_start; pPVar25 != pPVar7;
            pPVar25 = pPVar25 + 1) {
          local_218._0_4_ = (uint)*pPVar25 ^ uVar4 & 0x80000000;
          std::
          vector<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
          ::emplace_back<s2builderutil::PolygonDegeneracy>
                    (__return_storage_ptr__,(PolygonDegeneracy *)local_218);
        }
      }
      std::
      __sort<__gnu_cxx::__normal_iterator<s2builderutil::PolygonDegeneracy*,std::vector<s2builderutil::PolygonDegeneracy,std::allocator<s2builderutil::PolygonDegeneracy>>>,__gnu_cxx::__ops::_Iter_less_iter>
                ((__return_storage_ptr__->
                 super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                 )._M_impl.super__Vector_impl_data._M_start,
                 (__return_storage_ptr__->
                 super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                 )._M_impl.super__Vector_impl_data._M_finish);
      std::
      vector<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
      ::~vector(&components);
    }
    anon_unknown_0::DegeneracyFinder::~DegeneracyFinder(&local_1a8);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<PolygonDegeneracy> FindPolygonDegeneracies(const Graph& g,
                                                  S2Error* error) {
  CheckGraphOptions(g);
  if (g.options().degenerate_edges() == DegenerateEdges::DISCARD &&
      g.options().sibling_pairs() == SiblingPairs::DISCARD) {
    return {};  // All degeneracies have already been discarded.
  }
  return DegeneracyFinder(&g).Run(error);
}